

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O1

ByteData160 * cfd::core::HashUtil::Hash160(ByteData160 *__return_storage_ptr__,ByteData256 *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  ByteData256::GetBytes(&local_28,data);
  Hash160(__return_storage_ptr__,&local_28);
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

ByteData160 HashUtil::Hash160(const ByteData256 &data) {
  return Hash160(data.GetBytes());
}